

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata_test.cc
# Opt level: O3

void __thiscall
libaom_examples::anon_unknown_0::MultilayerMetadataTest_DoubleConversion_Test::TestBody
          (MultilayerMetadataTest_DoubleConversion_Test *this)

{
  undefined8 *puVar1;
  bool bVar2;
  char *in_R9;
  DepthRepresentationElement e;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  undefined8 *local_38;
  string local_30;
  DepthRepresentationElement local_10;
  
  TestConversion(0.0);
  TestConversion(1.789456e-05);
  TestConversion(-1.789456e-05);
  TestConversion(42.0);
  TestConversion(6.7894564456);
  TestConversion(67894564456.0);
  TestConversion(-67894564456.0);
  bVar2 = double_to_depth_representation_element(1e-10,&local_10);
  local_40[0] = (internal)!bVar2;
  local_38 = (undefined8 *)0x0;
  if ((bool)local_40[0]) {
    bVar2 = double_to_depth_representation_element(1e+30,&local_10);
    local_40[0] = (internal)!bVar2;
    local_38 = (undefined8 *)0x0;
    if ((bool)local_40[0]) {
      return;
    }
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)"double_to_depth_representation_element(1e+30, &e)","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/multilayer_metadata_test.cc"
               ,0xe4,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
  }
  else {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)"double_to_depth_representation_element(1e-10, &e)","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/multilayer_metadata_test.cc"
               ,0xe2,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  puVar1 = local_38;
  if (local_38 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_38 != local_38 + 2) {
      operator_delete((undefined8 *)*local_38);
    }
    operator_delete(puVar1);
  }
  return;
}

Assistant:

TEST(MultilayerMetadataTest, DoubleConversion) {
  TestConversion(0.0);
  TestConversion(1.789456e-5);
  TestConversion(-1.789456e-5);
  TestConversion(42);
  TestConversion(6.7894564456);
  TestConversion(6.7894564456e10);
  TestConversion(-6.7894564456e10);

  DepthRepresentationElement e;
  // Too small.
  ASSERT_FALSE(double_to_depth_representation_element(1e-10, &e));
  // Too big.
  ASSERT_FALSE(double_to_depth_representation_element(1e+30, &e));
}